

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3VdbeMemExpandBlob(Mem *pMem)

{
  byte *pbVar1;
  int iVar2;
  
  iVar2 = (pMem->u).nZero + pMem->n;
  if (iVar2 == 0 || SCARRY4((pMem->u).nZero,pMem->n) != iVar2 < 0) {
    if ((pMem->flags & 0x10) == 0) {
      return 0;
    }
    iVar2 = 1;
  }
  iVar2 = sqlite3VdbeMemGrow(pMem,iVar2,1);
  if (iVar2 == 0) {
    iVar2 = 0;
    memset(pMem->z + pMem->n,0,(long)(pMem->u).nZero);
    pMem->n = pMem->n + (pMem->u).nZero;
    pbVar1 = (byte *)((long)&pMem->flags + 1);
    *pbVar1 = *pbVar1 & 0xbd;
  }
  else {
    iVar2 = 7;
  }
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemExpandBlob(Mem *pMem){
  int nByte;
  assert( pMem->flags & MEM_Zero );
  assert( (pMem->flags&MEM_Blob)!=0 || MemNullNochng(pMem) );
  testcase( sqlite3_value_nochange(pMem) );
  assert( !sqlite3VdbeMemIsRowSet(pMem) );
  assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );

  /* Set nByte to the number of bytes required to store the expanded blob. */
  nByte = pMem->n + pMem->u.nZero;
  if( nByte<=0 ){
    if( (pMem->flags & MEM_Blob)==0 ) return SQLITE_OK;
    nByte = 1;
  }
  if( sqlite3VdbeMemGrow(pMem, nByte, 1) ){
    return SQLITE_NOMEM_BKPT;
  }

  memset(&pMem->z[pMem->n], 0, pMem->u.nZero);
  pMem->n += pMem->u.nZero;
  pMem->flags &= ~(MEM_Zero|MEM_Term);
  return SQLITE_OK;
}